

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

CURLcode inspect_response(Curl_cfilter *cf,Curl_easy *data,tunnel_stream *ts)

{
  CURLcode CVar1;
  dynhds_entry *local_38;
  dynhds_entry *auth_reply;
  CURLcode result;
  tunnel_stream *ts_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  local_38 = (dynhds_entry *)0x0;
  if (ts->resp->status / 100 == 2) {
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      Curl_infof(data,"CONNECT tunnel established, response %d",(ulong)(uint)ts->resp->status);
    }
    h2_tunnel_go_state(cf,ts,H2_TUNNEL_ESTABLISHED,data);
    return CURLE_OK;
  }
  if (ts->resp->status == 0x191) {
    local_38 = Curl_dynhds_cget(&ts->resp->headers,"WWW-Authenticate");
  }
  else if (ts->resp->status == 0x197) {
    local_38 = Curl_dynhds_cget(&ts->resp->headers,"Proxy-Authenticate");
  }
  if (local_38 != (dynhds_entry *)0x0) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
        (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"[0] CONNECT: fwd auth header \'%s\'",local_38->value);
    }
    CVar1 = Curl_http_input_auth(data,ts->resp->status == 0x197,local_38->value);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if ((data->req).newurl != (char *)0x0) {
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      h2_tunnel_go_state(cf,ts,H2_TUNNEL_INIT,data);
      return CURLE_OK;
    }
  }
  return CURLE_RECV_ERROR;
}

Assistant:

static CURLcode inspect_response(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 struct tunnel_stream *ts)
{
  CURLcode result = CURLE_OK;
  struct dynhds_entry *auth_reply = NULL;
  (void)cf;

  DEBUGASSERT(ts->resp);
  if(ts->resp->status/100 == 2) {
    infof(data, "CONNECT tunnel established, response %d", ts->resp->status);
    h2_tunnel_go_state(cf, ts, H2_TUNNEL_ESTABLISHED, data);
    return CURLE_OK;
  }

  if(ts->resp->status == 401) {
    auth_reply = Curl_dynhds_cget(&ts->resp->headers, "WWW-Authenticate");
  }
  else if(ts->resp->status == 407) {
    auth_reply = Curl_dynhds_cget(&ts->resp->headers, "Proxy-Authenticate");
  }

  if(auth_reply) {
    CURL_TRC_CF(data, cf, "[0] CONNECT: fwd auth header '%s'",
                auth_reply->value);
    result = Curl_http_input_auth(data, ts->resp->status == 407,
                                  auth_reply->value);
    if(result)
      return result;
    if(data->req.newurl) {
      /* Indicator that we should try again */
      Curl_safefree(data->req.newurl);
      h2_tunnel_go_state(cf, ts, H2_TUNNEL_INIT, data);
      return CURLE_OK;
    }
  }

  /* Seems to have failed */
  return CURLE_RECV_ERROR;
}